

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Gecko::Graph::node_neighbors
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,Graph *this,
          Index i)

{
  uint uVar1;
  pointer pNVar2;
  iterator __position;
  value_type_conflict *__x;
  long lVar3;
  ulong uVar4;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar2 = (this->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = pNVar2[i - 1].arc;
  uVar4 = (ulong)uVar1;
  if (uVar1 < pNVar2[i].arc) {
    lVar3 = uVar4 * 4;
    do {
      __x = (value_type_conflict *)
            ((long)(this->adj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start + lVar3);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert
                  (__return_storage_ptr__,__position,__x);
      }
      else {
        *__position._M_current = *__x;
        (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 4;
    } while (uVar4 < (this->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>.
                     _M_impl.super__Vector_impl_data._M_start[i].arc);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Node::Index>
Graph::node_neighbors(Node::Index i) const
{
  std::vector<Node::Index> neighbor;
  for (Arc::Index a = node_begin(i); a < node_end(i); a++)
    neighbor.push_back(adj[a]);
  return neighbor;
}